

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Bool prvTidyIsBlank(Lexer *lexer,Node *node)

{
  uint uVar1;
  Bool BVar2;
  Bool BVar3;
  
  BVar2 = prvTidynodeIsText(node);
  BVar3 = no;
  if (BVar2 != no) {
    uVar1 = node->start;
    BVar3 = yes;
    if ((node->end != uVar1) && (BVar3 = no, node->end == uVar1 + 1)) {
      BVar3 = (Bool)(lexer->lexbuf[uVar1] == ' ');
    }
  }
  return BVar3;
}

Assistant:

Bool TY_(IsBlank)(Lexer *lexer, Node *node)
{
    Bool isBlank = TY_(nodeIsText)(node);
    if ( isBlank )
        isBlank = ( node->end == node->start ||       /* Zero length */
                    ( node->end == node->start+1      /* or one blank. */
                      && lexer->lexbuf[node->start] == ' ' ) );
    return isBlank;
}